

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_thread.c
# Opt level: O0

void nsync_start_thread_(_func_void_void_ptr *f,void *arg)

{
  pthread_t local_28;
  pthread_t t;
  thd_args *args;
  void *arg_local;
  _func_void_void_ptr *f_local;
  
  args = (thd_args *)arg;
  arg_local = f;
  t = (pthread_t)malloc(0x10);
  *(void **)t = arg_local;
  *(thd_args **)(t + 8) = args;
  pthread_create(&local_28,(pthread_attr_t *)0x0,body,(void *)t);
  pthread_detach(local_28);
  return;
}

Assistant:

void nsync_start_thread_ (void (*f) (void *), void *arg) {
	struct thd_args *args = (struct thd_args *) malloc (sizeof (*args));
	pthread_t t;
	args->f = f;
	args->arg = arg;
	pthread_create (&t, NULL, body, args);
	pthread_detach (t);
}